

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       *this,handle src,bool param_2)

{
  CharT *pCVar1;
  bool bVar2;
  int iVar3;
  PyObject **ppPVar4;
  char *pcVar5;
  allocator local_69;
  string local_68 [32];
  char *local_48;
  CharT *buffer;
  Py_ssize_t size;
  handle local_30;
  handle load_src;
  bool param_2_local;
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this_local;
  handle src_local;
  
  local_30.m_ptr = src.m_ptr;
  load_src.m_ptr._7_1_ = param_2;
  this_local = (string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)src.m_ptr;
  bVar2 = pybind11::handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar2) {
    ppPVar4 = pybind11::handle::ptr(&local_30);
    iVar3 = ::PyType_HasFeature((*ppPVar4)->ob_type,0x10000000);
    if (iVar3 == 0) {
      size = (Py_ssize_t)local_30.m_ptr;
      src_local.m_ptr._7_1_ =
           load_bytes<char>(this,(enable_if_t<std::is_same<char,_char>::value,_handle>)
                                 local_30.m_ptr);
    }
    else {
      buffer = (CharT *)0xffffffffffffffff;
      ppPVar4 = pybind11::handle::ptr(&local_30);
      pcVar5 = (char *)PyUnicode_AsUTF8AndSize(*ppPVar4,&buffer);
      pCVar1 = buffer;
      local_48 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        PyErr_Clear();
        src_local.m_ptr._7_1_ = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,pcVar5,(ulong)pCVar1,&local_69);
        std::__cxx11::string::operator=((string *)this,local_68);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        src_local.m_ptr._7_1_ = true;
      }
    }
  }
  else {
    src_local.m_ptr._7_1_ = false;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

bool load(handle src, bool) {
#if PY_MAJOR_VERSION < 3
        object temp;
#endif
        handle load_src = src;
        if (!src) {
            return false;
        }
        if (!PyUnicode_Check(load_src.ptr())) {
#if PY_MAJOR_VERSION >= 3
            return load_bytes(load_src);
#else
            if (std::is_same<CharT, char>::value) {
                return load_bytes(load_src);
            }

            // The below is a guaranteed failure in Python 3 when PyUnicode_Check returns false
            if (!PYBIND11_BYTES_CHECK(load_src.ptr()))
                return false;

            temp = reinterpret_steal<object>(PyUnicode_FromObject(load_src.ptr()));
            if (!temp) { PyErr_Clear(); return false; }
            load_src = temp;
#endif
        }

#if PY_VERSION_HEX >= 0x03030000
        // On Python >= 3.3, for UTF-8 we avoid the need for a temporary `bytes`
        // object by using `PyUnicode_AsUTF8AndSize`.
        if (PYBIND11_SILENCE_MSVC_C4127(UTF_N == 8)) {
            Py_ssize_t size = -1;
            const auto *buffer
                = reinterpret_cast<const CharT *>(PyUnicode_AsUTF8AndSize(load_src.ptr(), &size));
            if (!buffer) {
                PyErr_Clear();
                return false;
            }
            value = StringType(buffer, static_cast<size_t>(size));
            return true;
        }
#endif

        auto utfNbytes = reinterpret_steal<object>(PyUnicode_AsEncodedString(
            load_src.ptr(), UTF_N == 8 ? "utf-8" : UTF_N == 16 ? "utf-16" : "utf-32", nullptr));
        if (!utfNbytes) { PyErr_Clear(); return false; }

        const auto *buffer = reinterpret_cast<const CharT *>(PYBIND11_BYTES_AS_STRING(utfNbytes.ptr()));
        size_t length = (size_t) PYBIND11_BYTES_SIZE(utfNbytes.ptr()) / sizeof(CharT);
        // Skip BOM for UTF-16/32
        if (PYBIND11_SILENCE_MSVC_C4127(UTF_N > 8)) {
            buffer++;
            length--;
        }
        value = StringType(buffer, length);

        // If we're loading a string_view we need to keep the encoded Python object alive:
        if (IsView)
            loader_life_support::add_patient(utfNbytes);

        return true;
    }